

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

string * __thiscall Parser::parse_word_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  _Head_base<0UL,_TextProvider_*,_false> _Var1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_21);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  bVar5 = 1;
  do {
    while( true ) {
      bVar2 = (**(code **)((long)((this->m_text_provider)._M_t.
                                  super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                  .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                                 _vptr_TextProvider + 0x10))();
      if ((bVar5 & bVar2) != 1) {
        return __return_storage_ptr__;
      }
      (**(code **)((long)((this->m_text_provider)._M_t.
                          super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                          .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                         _vptr_TextProvider + 0x18))();
      bVar3 = try_parse_return(this,false);
      _Var1._M_head_impl =
           (this->m_text_provider)._M_t.
           super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
           super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
           super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl;
      if (!bVar3) break;
LAB_001359d8:
      bVar5 = 0;
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TextProvider + 0x20))();
    }
    bVar5 = (_Var1._M_head_impl)->m_current_char;
    uVar4 = bVar5 - 0x20;
    if (((uVar4 < 0x3e) && ((0x2800000020001101U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) ||
       (bVar5 == 0x7c)) goto LAB_001359d8;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    bVar5 = 1;
  } while( true );
}

Assistant:

string Parser::parse_word()
{
	string current_string = "";
	current_string.push_back(m_text_provider->get_current_char());

	bool detected_word_end = false;
	while(m_text_provider->is_valid() && !detected_word_end)
	{
		m_text_provider->advance();
		if(try_parse_return(false))
		{
			detected_word_end = true;
			m_text_provider->reverse();
		}
		else
		{
			switch(m_text_provider->get_current_char())
			{
				case '=':
				case ',':
				case '(':
				case '[':
				case ']':
				case '|':
				case ' ':
					detected_word_end = true;
					m_text_provider->reverse();
				break;

				default:
					current_string.push_back(m_text_provider->get_current_char());
				break;
			}
		}
	}

	return current_string;
}